

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O0

void skiwi::compile_num2str(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t lab;
  uint64_t lab_00;
  uint64_t lab_01;
  uint64_t lab_02;
  uint64_t lab_03;
  operand local_304;
  operation local_300;
  operand local_2fc;
  operation local_2f8;
  operand local_2f4;
  operation local_2f0;
  operand local_2ec [2];
  operation local_2e4;
  operand local_2e0;
  operation local_2dc;
  code *local_2d8;
  operand local_2cc [2];
  operation local_2c4;
  operand local_2c0 [2];
  operation local_2b8;
  operand local_2b4 [2];
  operation local_2ac [2];
  operand local_2a4 [2];
  operation local_29c;
  operand local_298 [2];
  operation local_290;
  operand local_28c [2];
  operation local_284;
  operand local_280;
  operation local_27c;
  operand local_278;
  operation local_274 [2];
  operand local_26c;
  operation local_268;
  operand local_264;
  operation local_260;
  operand local_25c;
  operation local_258;
  operand local_254 [2];
  operation local_24c;
  operand local_248;
  operation local_244;
  code *local_240;
  operand local_238 [2];
  operation local_230 [2];
  operand local_228 [2];
  operation local_220;
  operand local_21c [2];
  operation local_214 [2];
  operand local_20c [2];
  operation local_204;
  operand local_200 [2];
  operation local_1f8;
  operand local_1f4 [2];
  operation local_1ec;
  operand local_1e8;
  operation local_1e4;
  operand local_1e0;
  operation local_1dc [2];
  operand local_1d4 [2];
  operation local_1cc [2];
  operand local_1c4 [2];
  operation local_1bc;
  unsigned_long local_1b8;
  operand local_1b0 [2];
  operation local_1a8 [4];
  operand local_198 [2];
  operation local_190 [4];
  operand local_180 [2];
  operation local_178 [4];
  operand local_168 [2];
  operation local_160 [3];
  operand local_154 [2];
  operation local_14c [3];
  operand local_140 [2];
  operation local_138 [2];
  operand local_130 [2];
  operation local_128 [3];
  operand local_11c [2];
  operation local_114 [3];
  operand local_108 [2];
  operation local_100 [3];
  operand local_f4 [2];
  operation local_ec;
  string local_e8;
  undefined1 local_c8 [8];
  string hex;
  string oct;
  string cont;
  undefined1 local_58 [8];
  string flonum;
  string error;
  compiler_options *ops_local;
  asmcode *code_local;
  
  std::__cxx11::string::string((string *)(flonum.field_2._M_local_buf + 8));
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_58,psVar1,lab);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)((long)&oct.field_2 + 8),psVar1,lab_00);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)((long)&hex.field_2 + 8),psVar1,lab_01);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_c8,psVar1,lab_02);
  psVar1 = label;
  if ((ops->safe_primitives & 1U) != 0) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_e8,psVar1,lab_03);
    std::__cxx11::string::operator=((string *)(flonum.field_2._M_local_buf + 8),(string *)&local_e8)
    ;
    std::__cxx11::string::~string((string *)&local_e8);
    local_ec = CMP;
    local_f4[1] = 0x14;
    local_f4[0] = NUMBER;
    local_100[2] = 2;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,&local_ec,local_f4 + 1,local_f4,(int *)(local_100 + 2));
    local_100[1] = 0x34;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_100 + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&flonum.field_2 + 8));
    local_100[0] = TEST;
    local_108[1] = 0xc;
    local_108[0] = NUMBER;
    local_114[2] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,local_100,local_108 + 1,local_108,(int *)(local_114 + 2));
    local_114[1] = 0x34;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_114 + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&flonum.field_2 + 8));
  }
  local_114[0] = TEST;
  local_11c[1] = 0xb;
  local_11c[0] = NUMBER;
  local_128[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_114,local_11c + 1,local_11c,(int *)(local_128 + 2));
  local_128[1] = 0x34;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_128 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  local_128[0] = SAR;
  local_130[1] = 0xb;
  local_130[0] = NUMBER;
  local_138[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_128,local_130 + 1,local_130,(int *)(local_138 + 1));
  local_138[0] = CMP;
  local_140[1] = 0xc;
  local_140[0] = NUMBER;
  local_14c[2] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_138,local_140 + 1,local_140,(int *)(local_14c + 2));
  local_14c[1] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_14c + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&hex.field_2 + 8));
  local_14c[0] = CMP;
  local_154[1] = 0xc;
  local_154[0] = NUMBER;
  local_160[2] = 0x20;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_14c,local_154 + 1,local_154,(int *)(local_160 + 2));
  local_160[1] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_160 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
  local_160[0] = MOV;
  local_168[1] = 0x18;
  local_168[0] = MEM_R10;
  local_178[3] = 200;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_160,local_168 + 1,local_168,(int *)(local_178 + 3));
  local_178[2] = 0x2c;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_178 + 2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&oct.field_2 + 8));
  local_178[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_178 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&hex.field_2 + 8));
  local_178[0] = MOV;
  local_180[1] = 0x18;
  local_180[0] = MEM_R10;
  local_190[3] = 0xd0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_178,local_180 + 1,local_180,(int *)(local_190 + 3));
  local_190[2] = 0x2c;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_190 + 2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&oct.field_2 + 8));
  local_190[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_190 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
  local_190[0] = MOV;
  local_198[1] = 0x18;
  local_198[0] = MEM_R10;
  local_1a8[3] = 0xd8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_190,local_198 + 1,local_198,(int *)(local_1a8 + 3));
  local_1a8[2] = 0x2c;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_1a8 + 2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&oct.field_2 + 8));
  local_1a8[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_1a8 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  if ((ops->safe_primitives & 1U) != 0) {
    jump_if_arg_is_not_block(code,RCX,R11,(string *)((long)&flonum.field_2 + 8));
  }
  local_1a8[0] = AND;
  local_1b0[1] = 0xb;
  local_1b0[0] = NUMBER;
  local_1b8 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_1a8,local_1b0 + 1,local_1b0,&local_1b8);
  if ((ops->safe_primitives & 1U) != 0) {
    jump_if_arg_does_not_point_to_flonum(code,RCX,R11,(string *)((long)&flonum.field_2 + 8));
  }
  local_1bc = MOV;
  local_1c4[1] = 0xb;
  local_1c4[0] = MEM_RCX;
  local_1cc[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_1bc,local_1c4 + 1,local_1c4,(int *)(local_1cc + 1));
  local_1cc[0] = MOV;
  local_1d4[1] = 0x18;
  local_1d4[0] = MEM_R10;
  local_1dc[1] = 0xe0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_1cc,local_1d4 + 1,local_1d4,(int *)(local_1dc + 1));
  local_1dc[0] = PUSH;
  local_1e0 = RDI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_1dc,&local_1e0);
  local_1e4 = PUSH;
  local_1e8 = RSI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_1e4,&local_1e8);
  local_1ec = MOVQ;
  local_1f4[1] = 0x43;
  local_1f4[0] = RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_1ec,local_1f4 + 1,local_1f4);
  local_1f8 = MOV;
  local_200[1] = 0xd;
  local_200[0] = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_1f8,local_200 + 1,local_200);
  local_204 = MOV;
  local_20c[1] = 0xe;
  local_20c[0] = MEM_R10;
  local_214[1] = 0xc0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_204,local_20c + 1,local_20c,(int *)(local_214 + 1));
  save_before_foreign_call(code);
  align_stack(code);
  local_214[0] = MOV;
  local_21c[1] = 0x18;
  local_21c[0] = R10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_214,local_21c + 1,local_21c);
  local_220 = MOV;
  local_228[1] = 9;
  local_228[0] = NUMBER;
  local_230[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_220,local_228 + 1,local_228,(int *)(local_230 + 1));
  local_230[0] = MOV;
  local_238[1] = 0x14;
  local_238[0] = NUMBER;
  local_240 = _skiwi_sprintf_floating;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_230,local_238 + 1,local_238,(unsigned_long *)&local_240);
  local_244 = CALLEXTERNAL;
  local_248 = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_244,&local_248);
  local_24c = MOV;
  local_254[1] = 0x13;
  local_254[0] = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_24c,local_254 + 1,local_254);
  restore_stack(code);
  restore_after_foreign_call(code);
  local_258 = POP;
  local_25c = RSI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_258,&local_25c);
  local_260 = POP;
  local_264 = RDI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_260,&local_264);
  allocate_buffer_as_string(code);
  local_268 = JMP;
  local_26c = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_268,&local_26c);
  local_274[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_274 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&oct.field_2 + 8));
  local_274[0] = PUSH;
  local_278 = RDI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_274,&local_278);
  local_27c = PUSH;
  local_280 = RSI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_27c,&local_280);
  local_284 = MOV;
  local_28c[1] = 0xc;
  local_28c[0] = RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_284,local_28c + 1,local_28c);
  local_290 = MOV;
  local_298[1] = 0xd;
  local_298[0] = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_290,local_298 + 1,local_298);
  local_29c = MOV;
  local_2a4[1] = 0xe;
  local_2a4[0] = MEM_R10;
  local_2ac[1] = 0xc0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_29c,local_2a4 + 1,local_2a4,(int *)(local_2ac + 1));
  save_before_foreign_call(code);
  align_stack(code);
  local_2ac[0] = MOV;
  local_2b4[1] = 0x18;
  local_2b4[0] = R10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_2ac,local_2b4 + 1,local_2b4);
  local_2b8 = XOR;
  local_2c0[1] = 9;
  local_2c0[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_2b8,local_2c0 + 1,local_2c0);
  local_2c4 = MOV;
  local_2cc[1] = 0x14;
  local_2cc[0] = NUMBER;
  local_2d8 = _skiwi_sprintf;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_2c4,local_2cc + 1,local_2cc,(unsigned_long *)&local_2d8);
  local_2dc = CALLEXTERNAL;
  local_2e0 = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_2dc,&local_2e0);
  local_2e4 = MOV;
  local_2ec[1] = 0x13;
  local_2ec[0] = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_2e4,local_2ec + 1,local_2ec);
  restore_stack(code);
  restore_after_foreign_call(code);
  local_2f0 = POP;
  local_2f4 = RSI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_2f0,&local_2f4);
  local_2f8 = POP;
  local_2fc = RDI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_2f8,&local_2fc);
  allocate_buffer_as_string(code);
  local_300 = JMP;
  local_304 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_300,&local_304);
  if ((ops->safe_primitives & 1U) != 0) {
    error_label(code,(string *)((long)&flonum.field_2 + 8),re_num2str_contract_violation);
  }
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)(hex.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(oct.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(flonum.field_2._M_local_buf + 8));
  return;
}

Assistant:

void compile_num2str(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  std::string flonum = label_to_string(label++);
  std::string cont = label_to_string(label++);
  std::string oct = label_to_string(label++);
  std::string hex = label_to_string(label++);
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
    code.add(asmcode::JNE, error);
    code.add(asmcode::TEST, asmcode::RDX, asmcode::NUMBER, 1);
    code.add(asmcode::JNE, error);
    }
  code.add(asmcode::TEST, asmcode::RCX, asmcode::NUMBER, 1);
  code.add(asmcode::JNE, flonum);
  code.add(asmcode::SAR, asmcode::RCX, asmcode::NUMBER, 1);
  code.add(asmcode::CMP, asmcode::RDX, asmcode::NUMBER, 16);
  code.add(asmcode::JES, oct);
  code.add(asmcode::CMP, asmcode::RDX, asmcode::NUMBER, 32);
  code.add(asmcode::JES, hex);
  code.add(asmcode::MOV, asmcode::R15, DCVT);
  code.add(asmcode::JMP, cont);
  code.add(asmcode::LABEL, oct);
  code.add(asmcode::MOV, asmcode::R15, OCVT);
  code.add(asmcode::JMP, cont);
  code.add(asmcode::LABEL, hex);
  code.add(asmcode::MOV, asmcode::R15, XCVT);
  code.add(asmcode::JMP, cont);
  code.add(asmcode::LABEL, flonum);
  if (ops.safe_primitives)
    {
    jump_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    {
    jump_if_arg_does_not_point_to_flonum(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::MOV, asmcode::RCX, asmcode::MEM_RCX, CELLS(1));
  code.add(asmcode::MOV, asmcode::R15, GCVT);

  /*
  Windows:
  rcx
  rdx
  r8

  Linux:
  rdi
  rsi
  rdx
  */
#ifdef _WIN32
  code.add(asmcode::PUSH, asmcode::R8);

  code.add(asmcode::MOV, asmcode::R8, asmcode::RCX);
  code.add(asmcode::MOVQ, asmcode::XMM2, asmcode::RCX);
  code.add(asmcode::MOV, asmcode::RDX, asmcode::R15);
  code.add(asmcode::MOV, asmcode::RCX, BUFFER);

#else
  code.add(asmcode::PUSH, asmcode::RDI);
  code.add(asmcode::PUSH, asmcode::RSI);

  code.add(asmcode::MOVQ, asmcode::XMM0, asmcode::RCX);
  code.add(asmcode::MOV, asmcode::RSI, asmcode::R15);
  code.add(asmcode::MOV, asmcode::RDI, BUFFER);
#endif

  save_before_foreign_call(code);
  align_stack(code);
  code.add(asmcode::MOV, asmcode::R15, CONTEXT); // r15 should be saved by the callee but r10 not, so we save the context in r15
#ifdef _WIN32
  code.add(asmcode::SUB, asmcode::RSP, asmcode::NUMBER, 32);
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, (uint64_t)&_skiwi_sprintf_floating);
#else
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, 1);
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, (uint64_t)&_skiwi_sprintf_floating);
#endif  
  code.add(asmcode::CALLEXTERNAL, asmcode::R11);
  code.add(asmcode::MOV, CONTEXT, asmcode::R15); // now we restore the context
  restore_stack(code);
  restore_after_foreign_call(code);

#ifdef _WIN32
  code.add(asmcode::POP, asmcode::R8);
#else
  code.add(asmcode::POP, asmcode::RSI);
  code.add(asmcode::POP, asmcode::RDI);
#endif

  allocate_buffer_as_string(code);

  code.add(asmcode::JMP, CONTINUE);


  code.add(asmcode::LABEL, cont); // rcx contains number, r15 contains format

  /*
  Windows:
  rcx
  rdx
  r8

  Linux:
  rdi
  rsi
  rdx
  */
#ifdef _WIN32
  code.add(asmcode::PUSH, asmcode::R8);

  code.add(asmcode::MOV, asmcode::R8, asmcode::RCX);
  code.add(asmcode::MOV, asmcode::RDX, asmcode::R15);
  code.add(asmcode::MOV, asmcode::RCX, BUFFER);

#else
  code.add(asmcode::PUSH, asmcode::RDI);
  code.add(asmcode::PUSH, asmcode::RSI);

  code.add(asmcode::MOV, asmcode::RDX, asmcode::RCX);
  code.add(asmcode::MOV, asmcode::RSI, asmcode::R15);
  code.add(asmcode::MOV, asmcode::RDI, BUFFER);
#endif

  save_before_foreign_call(code);
  align_stack(code);
  code.add(asmcode::MOV, asmcode::R15, CONTEXT); // r15 should be saved by the callee but r10 not, so we save the context in r15
#ifdef _WIN32
  code.add(asmcode::SUB, asmcode::RSP, asmcode::NUMBER, 32);
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, (uint64_t)&_skiwi_sprintf);
#else
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RAX);
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, (uint64_t)&_skiwi_sprintf);
#endif  
  code.add(asmcode::CALLEXTERNAL, asmcode::R11);
  code.add(asmcode::MOV, CONTEXT, asmcode::R15); // now we restore the context
  restore_stack(code);
  restore_after_foreign_call(code);

#ifdef _WIN32
  code.add(asmcode::POP, asmcode::R8);
#else
  code.add(asmcode::POP, asmcode::RSI);
  code.add(asmcode::POP, asmcode::RDI);
#endif

  allocate_buffer_as_string(code);

  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_num2str_contract_violation);
    }
  }